

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

int __thiscall mpt::pipe<char>::~pipe(pipe<char> *this,int *__pipedes)

{
  bool bVar1;
  int extraout_EAX;
  
  do {
    bVar1 = pop(this,(char *)0x0);
  } while (bVar1);
  reference<mpt::pipe<char>::instance>::~reference(&this->_d);
  return extraout_EAX;
}

Assistant:

~pipe()
	{
		while (pop());
	}